

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_IgnoreField_NestedMessage_Test::TestBody
          (MessageDifferencerTest_IgnoreField_NestedMessage_Test *this)

{
  void *pvVar1;
  FieldDescriptor *field;
  TestDiffMessage msg1;
  TestDiffMessage msg2;
  MessageDifferencer differencer;
  Message *local_350;
  string *local_348;
  Message local_340;
  undefined1 local_330 [184];
  undefined1 local_278 [184];
  MessageDifferencer local_1c0;
  
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_330,(Arena *)0x0);
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_278,(Arena *)0x0);
  pvVar1 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_330 + 0x70),
                      Arena::DefaultConstruct<proto2_unittest::TestField>);
  *(undefined4 *)((long)pvVar1 + 0x48) = 3;
  *(byte *)((long)pvVar1 + 0x10) = *(byte *)((long)pvVar1 + 0x10) | 2;
  RepeatedField<int>::Add((RepeatedField<int> *)((long)pvVar1 + 0x18),1);
  pvVar1 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_278 + 0x70),
                      Arena::DefaultConstruct<proto2_unittest::TestField>);
  *(undefined4 *)((long)pvVar1 + 0x48) = 4;
  *(byte *)((long)pvVar1 + 0x10) = *(byte *)((long)pvVar1 + 0x10) | 2;
  RepeatedField<int>::Add((RepeatedField<int> *)((long)pvVar1 + 0x18),1);
  util::MessageDifferencer::MessageDifferencer(&local_1c0);
  local_350 = &local_340;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"rm.c","");
  field = GetFieldDescriptor((anon_unknown_0 *)local_330,local_350,local_348);
  util::MessageDifferencer::IgnoreField(&local_1c0,field);
  if (local_350 != &local_340) {
    operator_delete(local_350,(long)local_340.super_MessageLite._vptr_MessageLite + 1);
  }
  ExpectEqualsWithDifferencer(&local_1c0,(Message *)local_330,(Message *)local_278);
  util::MessageDifferencer::~MessageDifferencer(&local_1c0);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_278);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_330);
  return;
}

Assistant:

TEST(MessageDifferencerTest, IgnoreField_NestedMessage) {
  proto2_unittest::TestDiffMessage msg1;
  proto2_unittest::TestDiffMessage msg2;

  proto2_unittest::TestField* field;

  field = msg1.add_rm();
  field->set_c(3);
  field->add_rc(1);

  field = msg2.add_rm();
  field->set_c(4);
  field->add_rc(1);

  util::MessageDifferencer differencer;
  differencer.IgnoreField(GetFieldDescriptor(msg1, "rm.c"));

  ExpectEqualsWithDifferencer(&differencer, msg1, msg2);
}